

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O2

item * __thiscall NaDynAr<char_*>::fetch_item(NaDynAr<char_*> *this,int index)

{
  item *piVar1;
  item **ppiVar2;
  bool bVar3;
  
  piVar1 = (item *)0x0;
  if ((-1 < index) && (index < this->nItems)) {
    ppiVar2 = &this->pHead;
    while( true ) {
      piVar1 = *ppiVar2;
      bVar3 = index == 0;
      index = index + -1;
      if (bVar3) break;
      ppiVar2 = &piVar1->pNext;
    }
  }
  return piVar1;
}

Assistant:

item*		fetch_item (int index) const {
    if(!good(index))
      return NULL;

    int	i;
    item	*p = pHead;

    for(i = 0; i < index; ++i)
      p = p->pNext;

    return p;
  }